

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

bool __thiscall irr::core::string<char>::operator==(string<char> *this,string<char> *other)

{
  char *pcVar1;
  char *pcVar2;
  byte bVar3;
  s32 i;
  long lVar4;
  
  lVar4 = 0;
  do {
    pcVar1 = this->array + lVar4;
    bVar3 = 1;
    if ((*pcVar1 == '\0') || (pcVar2 = other->array + lVar4, *pcVar2 == '\0')) goto LAB_005b005d;
    lVar4 = lVar4 + 1;
  } while (*pcVar1 == *pcVar2);
  bVar3 = 0;
LAB_005b005d:
  return (bool)(this->used == other->used & bVar3);
}

Assistant:

bool operator ==(const string<T>& other) const
	{
		for(s32 i=0; array[i] && other.array[i]; ++i)
			if (array[i] != other.array[i])
				return false;

		return used == other.used;
	}